

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe(uv_os_fd_t *fds,int read_flags,int write_flags)

{
  int iVar1;
  int *piVar2;
  uint local_30;
  int local_2c;
  int flags;
  int err;
  uv_os_fd_t temp [2];
  int write_flags_local;
  int read_flags_local;
  uv_os_fd_t *fds_local;
  
  local_30 = 0x80000;
  if (((read_flags & 0x40U) != 0) && ((write_flags & 0x40U) != 0)) {
    local_30 = 0x80800;
  }
  temp[0] = write_flags;
  temp[1] = read_flags;
  iVar1 = pipe2(&flags,local_30);
  if (iVar1 == 0) {
    if ((local_30 & 0x800) == 0) {
      if ((((temp[1] & 0x40U) == 0) || (local_2c = uv__nonblock_ioctl(flags,1), local_2c == 0)) &&
         (((temp[0] & 0x40U) == 0 || (local_2c = uv__nonblock_ioctl(err,1), local_2c == 0)))) {
        *fds = flags;
        fds[1] = err;
        fds_local._4_4_ = 0;
      }
      else {
        uv__close(flags);
        uv__close(err);
        fds_local._4_4_ = local_2c;
      }
    }
    else {
      *fds = flags;
      fds[1] = err;
      fds_local._4_4_ = 0;
    }
  }
  else {
    piVar2 = __errno_location();
    fds_local._4_4_ = -*piVar2;
  }
  return fds_local._4_4_;
}

Assistant:

int uv_pipe(uv_os_fd_t fds[2], int read_flags, int write_flags) {
  uv_os_fd_t temp[2];
  int err;
#if defined(__FreeBSD__) || defined(__linux__)
  int flags = O_CLOEXEC;

  if ((read_flags & UV_NONBLOCK_PIPE) && (write_flags & UV_NONBLOCK_PIPE))
    flags |= UV_FS_O_NONBLOCK;

  if (pipe2(temp, flags))
    return UV__ERR(errno);

  if (flags & UV_FS_O_NONBLOCK) {
    fds[0] = temp[0];
    fds[1] = temp[1];
    return 0;
  }
#else
  if (pipe(temp))
    return UV__ERR(errno);

  if ((err = uv__cloexec(temp[0], 1)))
    goto fail;

  if ((err = uv__cloexec(temp[1], 1)))
    goto fail;
#endif

  if (read_flags & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[0], 1)))
      goto fail;

  if (write_flags & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[1], 1)))
      goto fail;

  fds[0] = temp[0];
  fds[1] = temp[1];
  return 0;

fail:
  uv__close(temp[0]);
  uv__close(temp[1]);
  return err;
}